

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

char * pathdup(char *path)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  ulong local_30;
  size_t len;
  size_t i;
  char *str;
  char *path_local;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    path_local = (char *)0x0;
  }
  else {
    local_30 = strlen(path);
    while( true ) {
      bVar3 = false;
      if (local_30 != 0) {
        bVar3 = path[local_30 - 1] == '/';
      }
      if (!bVar3) break;
      local_30 = local_30 - 1;
    }
    path_local = (char *)malloc(local_30 + 1);
    if (path_local == (char *)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      error("malloc()");
    }
    if (L_opt == 0) {
      memcpy(path_local,path,local_30);
    }
    else {
      for (len = 0; len < local_30; len = len + 1) {
        iVar1 = tolower((uint)(byte)path[len]);
        path_local[len] = (char)iVar1;
      }
    }
    path_local[local_30] = '\0';
  }
  return path_local;
}

Assistant:

static char *
pathdup(const char *path)
{
	char *str;
	size_t i, len;

	if (path == NULL || path[0] == '\0')
		return (NULL);

	len = strlen(path);
	while (len && path[len - 1] == '/')
		len--;
	if ((str = malloc(len + 1)) == NULL) {
		errno = ENOMEM;
		error("malloc()");
	}
	if (L_opt) {
		for (i = 0; i < len; ++i)
			str[i] = (char)tolower((unsigned char)path[i]);
	} else {
		memcpy(str, path, len);
	}
	str[len] = '\0';

	return (str);
}